

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Di<(moira::Mode)5,_4> wrapper)

{
  StrWriter *pSVar1;
  Int local_40;
  An local_3c;
  An local_38;
  Int local_34;
  An local_30;
  Int local_2c;
  Ea<(moira::Mode)5,_4> *local_28;
  Ea<(moira::Mode)5,_4> *ea;
  StrWriter *this_local;
  Di<(moira::Mode)5,_4> wrapper_local;
  
  local_28 = wrapper.ea;
  ea = (Ea<(moira::Mode)5,_4> *)this;
  this_local = (StrWriter *)wrapper.ea;
  switch(this->style->syntax) {
  case MOIRA:
  case MUSASHI:
    pSVar1 = operator<<(this,"(");
    Int::Int(&local_2c,(int)(short)local_28->ext1);
    pSVar1 = operator<<(pSVar1,local_2c);
    pSVar1 = operator<<(pSVar1,",");
    An::An(&local_30,(uint)local_28->reg);
    pSVar1 = operator<<(pSVar1,local_30);
    operator<<(pSVar1,")");
    break;
  case MOIRA_MIT:
  case GNU_MIT:
    An::An(&local_3c,(uint)(wrapper.ea)->reg);
    pSVar1 = operator<<(this,local_3c);
    pSVar1 = operator<<(pSVar1,"@(");
    Int::Int(&local_40,(int)(short)local_28->ext1);
    pSVar1 = operator<<(pSVar1,local_40);
    operator<<(pSVar1,")");
    break;
  case GNU:
    Int::Int(&local_34,(int)(short)(wrapper.ea)->ext1);
    pSVar1 = operator<<(this,local_34);
    pSVar1 = operator<<(pSVar1,"(");
    An::An(&local_38,(uint)local_28->reg);
    pSVar1 = operator<<(pSVar1,local_38);
    operator<<(pSVar1,")");
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Di<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:

            *this << "(" << Int{(i16)ea.ext1} << "," << An{ea.reg} << ")";
            return *this;

       case Syntax::GNU:

            *this << Int{(i16)ea.ext1} << "(" << An{ea.reg} << ")";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@(" << Int{(i16)ea.ext1} << ")";
            break;
    }

    return *this;
}